

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O1

bool __thiscall
EnrichableI2cAnalyzer::GetBitPartOne
          (EnrichableI2cAnalyzer *this,BitState *bit_state,U64 *sck_rising_edge,
          U64 *frame_end_sample)

{
  AnalyzerChannelData *pAVar1;
  char cVar2;
  byte bVar3;
  BitState BVar4;
  U64 UVar5;
  ulong uVar6;
  ulong uVar7;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  UVar5 = AnalyzerChannelData::GetSampleNumber();
  *sck_rising_edge = UVar5;
  *frame_end_sample = UVar5;
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSda);
  BVar4 = AnalyzerChannelData::GetBitState();
  *bit_state = BVar4;
  do {
    cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar2 != '\0') goto LAB_001085b0;
    cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  } while (cVar2 == '\0');
  cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if (cVar2 != '\0') {
    uVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
    uVar7 = AnalyzerChannelData::GetSampleOfNextEdge();
    if (uVar6 < uVar7) {
LAB_001085b0:
      AnalyzerChannelData::GetSampleOfNextEdge();
      bVar3 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)this->mSda)
      ;
      if (bVar3 == 0) {
        cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if (cVar2 != '\0') {
          UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
          *frame_end_sample = UVar5;
        }
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        pAVar1 = this->mScl;
        AnalyzerChannelData::GetSampleNumber();
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
        RecordStartStopBit(this);
      }
      return (bool)(bVar3 ^ 1);
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  pAVar1 = this->mScl;
  AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
  RecordStartStopBit(this);
  return false;
}

Assistant:

bool EnrichableI2cAnalyzer::GetBitPartOne( BitState& bit_state, U64& sck_rising_edge, U64& frame_end_sample )
{
	//SCL must be low coming into this function
	mScl->AdvanceToNextEdge(); //posedge
	sck_rising_edge = mScl->GetSampleNumber();
	frame_end_sample = sck_rising_edge;
	mSda->AdvanceToAbsPosition( sck_rising_edge );  //data read on SCL posedge

	bit_state = mSda->GetBitState();

	//clock is on the rising edge, and data is at the same location.

	while( mScl->DoMoreTransitionsExistInCurrentData() == false )
	{
		// there are no more SCL transtitions, at least yet.
		if( mSda->DoMoreTransitionsExistInCurrentData() == true )
		{
			//there ARE some SDA transtions, let's double check to make sure there's still no SDA activity
			if( mScl->DoMoreTransitionsExistInCurrentData() == true )
			{
				if( mScl->GetSampleOfNextEdge() < mSda->GetSampleOfNextEdge() )
					break; //there is not a stop or start condition here, everything is normal - we should jump out now.
			}
			

			//ok, for sure we can advance to the next SDA edge without running past any SCL events.
			mSda->AdvanceToNextEdge();
			mScl->AdvanceToAbsPosition( mSda->GetSampleNumber() ); //clock is still high, we're just moving it to the stop condition here.
			RecordStartStopBit();
			return false;
		}
	}

	//ok, so there are more transitions on the clock channel, so the above code path didn't run.
	U64 sample_of_next_clock_falling_edge = mScl->GetSampleOfNextEdge();
	while( mSda->WouldAdvancingToAbsPositionCauseTransition( sample_of_next_clock_falling_edge - 1 ) == true )
	{
		//clock is high -- SDA changes indicate start, stop, etc.
		mSda->AdvanceToNextEdge();
		mScl->AdvanceToAbsPosition( mSda->GetSampleNumber() ); //advance the clock to match the SDA channel.
		RecordStartStopBit();
		return false;
	}

	if( mScl->DoMoreTransitionsExistInCurrentData() == true )
	{
		frame_end_sample = mScl->GetSampleOfNextEdge();
	}

	return true;
	
}